

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O0

cmMakefileTargetGenerator * cmMakefileTargetGenerator::New(cmGeneratorTarget *tgt)

{
  int iVar1;
  cmMakefileLibraryTargetGenerator *local_20;
  cmMakefileTargetGenerator *result;
  cmGeneratorTarget *tgt_local;
  
  iVar1 = cmGeneratorTarget::GetType(tgt);
  if (iVar1 == 0) {
    local_20 = (cmMakefileLibraryTargetGenerator *)operator_new(0x3d0);
    cmMakefileExecutableTargetGenerator::cmMakefileExecutableTargetGenerator
              ((cmMakefileExecutableTargetGenerator *)local_20,tgt);
  }
  else if (iVar1 - 1U < 4) {
    local_20 = (cmMakefileLibraryTargetGenerator *)operator_new(0x3f0);
    cmMakefileLibraryTargetGenerator::cmMakefileLibraryTargetGenerator(local_20,tgt);
  }
  else {
    if (iVar1 != 5) {
      return (cmMakefileTargetGenerator *)0x0;
    }
    local_20 = (cmMakefileLibraryTargetGenerator *)operator_new(0x3d0);
    cmMakefileUtilityTargetGenerator::cmMakefileUtilityTargetGenerator
              ((cmMakefileUtilityTargetGenerator *)local_20,tgt);
  }
  return &local_20->super_cmMakefileTargetGenerator;
}

Assistant:

cmMakefileTargetGenerator *
cmMakefileTargetGenerator::New(cmGeneratorTarget *tgt)
{
  cmMakefileTargetGenerator *result = 0;

  switch (tgt->GetType())
    {
    case cmTarget::EXECUTABLE:
      result = new cmMakefileExecutableTargetGenerator(tgt);
      break;
    case cmTarget::STATIC_LIBRARY:
    case cmTarget::SHARED_LIBRARY:
    case cmTarget::MODULE_LIBRARY:
    case cmTarget::OBJECT_LIBRARY:
      result = new cmMakefileLibraryTargetGenerator(tgt);
      break;
    case cmTarget::UTILITY:
      result = new cmMakefileUtilityTargetGenerator(tgt);
      break;
    default:
      return result;
      // break; /* unreachable */
    }
  return result;
}